

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkSkeletonBlifMv(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  Abc_Obj_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  int iVar5;
  Abc_Ntk_t *pNtk_00;
  char *pcVar6;
  Abc_Obj_t *pAVar7;
  long *plVar8;
  int *piVar9;
  void *pvVar10;
  uint *puVar11;
  Abc_Obj_t *pAVar12;
  Abc_Obj_t *pAVar13;
  Abc_Obj_t *pAVar14;
  Vec_Ptr_t *pVVar15;
  int extraout_EDX;
  int extraout_EDX_00;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long lVar16;
  long extraout_RDX_05;
  long extraout_RDX_06;
  int iVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  bool bVar22;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x2de,"Abc_Ntk_t *Abc_NtkSkeletonBlifMv(Abc_Ntk_t *)");
  }
  if (pNtk->ntkFunc != ABC_FUNC_BLIFMV) {
    __assert_fail("Abc_NtkHasBlifMv(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x2df,"Abc_Ntk_t *Abc_NtkSkeletonBlifMv(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[9] != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x2e0,"Abc_Ntk_t *Abc_NtkSkeletonBlifMv(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[10] != 0) {
    __assert_fail("Abc_NtkBlackboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x2e1,"Abc_Ntk_t *Abc_NtkSkeletonBlifMv(Abc_Ntk_t *)");
  }
  Abc_NtkCleanCopy(pNtk);
  pNtk_00 = Abc_NtkAlloc(pNtk->ntkType,pNtk->ntkFunc,1);
  pcVar6 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pName = pcVar6;
  pcVar6 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pSpec = pcVar6;
  pAVar7 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_WHITEBOX);
  pVVar15 = pNtk->vPis;
  lVar16 = extraout_RDX;
  if (0 < pVVar15->nSize) {
    lVar18 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar15->pArray[lVar18];
      Abc_NtkDupObj(pNtk_00,pAVar2,0);
      pAVar12 = (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanouts).pArray];
      Abc_NtkDupObj(pNtk_00,pAVar12,1);
      Abc_ObjAddFanin((pAVar12->field_6).pCopy,(pAVar2->field_6).pCopy);
      lVar18 = lVar18 + 1;
      pVVar15 = pNtk->vPis;
      lVar16 = extraout_RDX_00;
    } while (lVar18 < pVVar15->nSize);
  }
  pVVar15 = pNtk->vPos;
  if (0 < pVVar15->nSize) {
    lVar18 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar15->pArray[lVar18];
      Abc_NtkDupObj(pNtk_00,pAVar2,0);
      pAVar12 = (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray];
      pAVar13 = (pAVar12->field_6).pCopy;
      if (pAVar13 == (Abc_Obj_t *)0x0) {
        Abc_NtkDupObj(pNtk_00,pAVar12,1);
        pAVar13 = (pAVar12->field_6).pCopy;
      }
      Abc_ObjAddFanin((pAVar2->field_6).pCopy,pAVar13);
      lVar18 = lVar18 + 1;
      pVVar15 = pNtk->vPos;
      lVar16 = extraout_RDX_01;
    } while (lVar18 < pVVar15->nSize);
  }
  pVVar15 = pNtk->vBoxes;
  if (0 < pVVar15->nSize) {
    lVar18 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar15->pArray[lVar18];
      if ((*(uint *)&pAVar2->field_0x14 & 0xf) == 8) {
        Abc_NtkDupBox(pNtk_00,pAVar2,0);
        plVar8 = (long *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanouts).pArray];
        pAVar12 = *(Abc_Obj_t **)
                   (*(long *)(*(long *)(*plVar8 + 0x20) + 8) + (long)*(int *)plVar8[6] * 8);
        if ((pAVar12->field_6).pTemp != (void *)0x0) {
          __assert_fail("pNet->pCopy == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                        ,0x304,"Abc_Ntk_t *Abc_NtkSkeletonBlifMv(Abc_Ntk_t *)");
        }
        Abc_NtkDupObj(pNtk_00,pAVar12,1);
        Abc_ObjAddFanin((pAVar12->field_6).pCopy,
                        *(Abc_Obj_t **)
                         ((long)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanouts).pArray] + 0x40));
        plVar8 = (long *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray];
        pAVar12 = *(Abc_Obj_t **)
                   (*(long *)(*(long *)(*plVar8 + 0x20) + 8) + (long)*(int *)plVar8[4] * 8);
        pAVar13 = (pAVar12->field_6).pCopy;
        if (pAVar13 == (Abc_Obj_t *)0x0) {
          Abc_NtkDupObj(pNtk_00,pAVar12,1);
          plVar8 = (long *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray];
          pAVar13 = (pAVar12->field_6).pCopy;
        }
        Abc_ObjAddFanin((Abc_Obj_t *)plVar8[8],pAVar13);
        pVVar15 = pNtk->vBoxes;
        lVar16 = extraout_RDX_02;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < pVVar15->nSize);
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar5 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar5 + 500;
    iVar17 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar17) {
      piVar9 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar9;
      if (piVar9 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar17;
      lVar16 = extraout_RDX_03;
    }
    else {
      piVar9 = (int *)0x0;
    }
    if (-500 < iVar5) {
      memset(piVar9,0,(uVar1 & 0xffffffff) << 2);
      lVar16 = extraout_RDX_04;
    }
    (pNtk->vTravIds).nSize = iVar17;
  }
  iVar5 = pNtk->nTravIds;
  pNtk->nTravIds = iVar5 + 1;
  if (0x3ffffffe < iVar5) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar15 = pNtk->vCis;
  if (0 < pVVar15->nSize) {
    lVar16 = 0;
    do {
      pAVar2 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*pVVar15->pArray[lVar16] + 0x20) + 8) +
                (long)**(int **)((long)pVVar15->pArray[lVar16] + 0x30) * 8);
      pVVar15 = pAVar2->pNtk->vAttrs;
      if (pVVar15->nSize < 0xd) goto LAB_00840ac6;
      uVar21 = 2;
      iVar5 = 1;
      if ((pVVar15->pArray[0xc] == (void *)0x0) ||
         (pvVar10 = Abc_ObjMvVar(pAVar2), pvVar10 == (void *)0x0)) {
LAB_008406aa:
        iVar20 = 0;
        do {
          pAVar12 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
          pcVar6 = Abc_SopEncoderLog((Mem_Flex_t *)pNtk_00->pManFunc,iVar20,uVar21);
          (pAVar12->field_5).pData = pcVar6;
          pAVar13 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NET);
          pAVar14 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_BI);
          Abc_ObjAddFanin(pAVar12,(pAVar2->field_6).pCopy);
          Abc_ObjAddFanin(pAVar13,pAVar12);
          Abc_ObjAddFanin(pAVar14,pAVar13);
          Abc_ObjAddFanin(pAVar7,pAVar14);
          iVar20 = iVar20 + 1;
          iVar17 = extraout_EDX_00;
        } while (iVar5 != iVar20);
      }
      else {
        puVar11 = (uint *)Abc_ObjMvVar(pAVar2);
        uVar21 = *puVar11;
        bVar22 = uVar21 == 1;
        if (1 < uVar21) {
          uVar19 = 0x1f;
          if (uVar21 - 1 != 0) {
            for (; uVar21 - 1 >> uVar19 == 0; uVar19 = uVar19 - 1) {
            }
          }
          iVar5 = (uVar19 ^ 0xffffffe0) + 0x21;
          goto LAB_008406aa;
        }
        iVar5 = 1;
        uVar21 = 1;
        iVar17 = extraout_EDX;
        if (bVar22) goto LAB_008406aa;
      }
      pAVar3 = pAVar2->pNtk;
      iVar5 = pAVar2->Id;
      iVar20 = pAVar3->nTravIds;
      Vec_IntFillExtra(&pAVar3->vTravIds,iVar5 + 1,iVar17);
      if (((long)iVar5 < 0) || ((pAVar3->vTravIds).nSize <= iVar5)) goto LAB_00840a88;
      (pAVar3->vTravIds).pArray[iVar5] = iVar20;
      lVar16 = lVar16 + 1;
      pVVar15 = pNtk->vCis;
    } while (lVar16 < pVVar15->nSize);
  }
  pVVar15 = pNtk->vCos;
  if (0 < pVVar15->nSize) {
    lVar18 = 0;
    do {
      pAVar2 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*pVVar15->pArray[lVar18] + 0x20) + 8) +
                (long)**(int **)((long)pVVar15->pArray[lVar18] + 0x20) * 8);
      pAVar3 = pAVar2->pNtk;
      iVar5 = pAVar2->Id;
      Vec_IntFillExtra(&pAVar3->vTravIds,iVar5 + 1,(int)lVar16);
      if (((long)iVar5 < 0) || ((pAVar3->vTravIds).nSize <= iVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pAVar4 = pAVar2->pNtk;
      iVar17 = pAVar4->nTravIds;
      lVar16 = extraout_RDX_05;
      if ((pAVar3->vTravIds).pArray[iVar5] != iVar17) {
        iVar5 = pAVar2->Id;
        Vec_IntFillExtra(&pAVar4->vTravIds,iVar5 + 1,(int)extraout_RDX_05);
        if (((long)iVar5 < 0) || ((pAVar4->vTravIds).nSize <= iVar5)) {
LAB_00840a88:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (pAVar4->vTravIds).pArray[iVar5] = iVar17;
        pVVar15 = pAVar2->pNtk->vAttrs;
        if (pVVar15->nSize < 0xd) goto LAB_00840ac6;
        uVar21 = 2;
        uVar19 = 1;
        if ((pVVar15->pArray[0xc] != (void *)0x0) &&
           (pvVar10 = Abc_ObjMvVar(pAVar2), pvVar10 != (void *)0x0)) {
          puVar11 = (uint *)Abc_ObjMvVar(pAVar2);
          uVar21 = *puVar11;
          uVar19 = 0x1f;
          if (uVar21 - 1 != 0) {
            for (; uVar21 - 1 >> uVar19 == 0; uVar19 = uVar19 - 1) {
            }
          }
          uVar19 = (uVar19 ^ 0xffffffe0) + 0x21;
          if (uVar21 < 2) {
            uVar19 = uVar21;
          }
        }
        pAVar12 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
        pcVar6 = Abc_SopDecoderLog((Mem_Flex_t *)pNtk_00->pManFunc,uVar21);
        (pAVar12->field_5).pData = pcVar6;
        for (; uVar19 != 0; uVar19 = uVar19 - 1) {
          pAVar13 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_BO);
          pAVar14 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NET);
          Abc_ObjAddFanin(pAVar13,pAVar7);
          Abc_ObjAddFanin(pAVar14,pAVar13);
          Abc_ObjAddFanin(pAVar12,pAVar14);
        }
        Abc_ObjAddFanin((pAVar2->field_6).pCopy,pAVar12);
        lVar16 = extraout_RDX_06;
      }
      lVar18 = lVar18 + 1;
      pVVar15 = pNtk->vCos;
    } while (lVar18 < pVVar15->nSize);
  }
  if (pNtk->ntkFunc == ABC_FUNC_BLIFMV) {
    if (pNtk->vAttrs->nSize < 0xd) {
LAB_00840ac6:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if (pNtk->vAttrs->pArray[0xc] != (void *)0x0) {
      if (pNtk_00->vAttrs->nSize < 0xd) goto LAB_00840ac6;
      if (pNtk_00->vAttrs->pArray[0xc] == (void *)0x0) {
        Abc_NtkStartMvVars(pNtk_00);
      }
      pVVar15 = pNtk->vObjs;
      if (0 < pVVar15->nSize) {
        lVar16 = 0;
        do {
          pAVar7 = (Abc_Obj_t *)pVVar15->pArray[lVar16];
          if (((pAVar7 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar7->field_0x14 & 0xf) == 6)) &&
             (pAVar2 = (pAVar7->field_6).pCopy, pAVar2 != (Abc_Obj_t *)0x0)) {
            pVVar15 = pAVar7->pNtk->vAttrs;
            if (pVVar15->nSize < 0xd) goto LAB_00840ac6;
            iVar5 = 2;
            if ((pVVar15->pArray[0xc] != (void *)0x0) &&
               (pvVar10 = Abc_ObjMvVar(pAVar7), pvVar10 != (void *)0x0)) {
              piVar9 = (int *)Abc_ObjMvVar(pAVar7);
              iVar5 = *piVar9;
            }
            Abc_NtkSetMvVarValues(pAVar2,iVar5);
            pVVar15 = pNtk->vObjs;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < pVVar15->nSize);
      }
    }
  }
  iVar5 = Abc_NtkCheck(pNtk_00);
  if (iVar5 == 0) {
    fwrite("Abc_NtkSkeletonBlifMv(): Network check has failed.\n",0x33,1,_stdout);
    Abc_NtkDelete(pNtk_00);
    pNtk_00 = (Abc_Ntk_t *)0x0;
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkSkeletonBlifMv( Abc_Ntk_t * pNtk )
{
    int fUsePositional = 0;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pNet, * pNetNew, * pNodeNew, * pTermNew, * pBoxNew;
    int i, k, v, nValues, nBits;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_NtkHasBlifMv(pNtk) );
    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );
    assert( Abc_NtkBlackboxNum(pNtk) == 0 );

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );

    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav( pNtk->pName );
    pNtkNew->pSpec = Extra_UtilStrsav( pNtk->pName );
    // create the internal box (it is important to put it first!)
    pBoxNew = Abc_NtkCreateWhitebox( pNtkNew );
    // create PIs and their nets
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
        pNet = Abc_ObjFanout0(pObj);
        Abc_NtkDupObj( pNtkNew, pNet, 1 );
        Abc_ObjAddFanin( pNet->pCopy, pObj->pCopy );
    }
    // create POs and their nets
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
        pNet = Abc_ObjFanin0(pObj);
        if ( pNet->pCopy == NULL )
            Abc_NtkDupObj( pNtkNew, pNet, 1 );
        Abc_ObjAddFanin( pObj->pCopy, pNet->pCopy );
    }
    // create latches
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        Abc_NtkDupBox( pNtkNew, pObj, 0 );
        // latch outputs
        pNet = Abc_ObjFanout0(Abc_ObjFanout0(pObj));
        assert( pNet->pCopy == NULL );
        Abc_NtkDupObj( pNtkNew, pNet, 1 );
        Abc_ObjAddFanin( pNet->pCopy, Abc_ObjFanout0(pObj)->pCopy );
        // latch inputs
        pNet = Abc_ObjFanin0(Abc_ObjFanin0(pObj));
        if ( pNet->pCopy == NULL )
            Abc_NtkDupObj( pNtkNew, pNet, 1 );
        Abc_ObjAddFanin( Abc_ObjFanin0(pObj)->pCopy, pNet->pCopy );
    }

    // encode the CI nets
    Abc_NtkIncrementTravId( pNtk );
    if ( fUsePositional )
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            for ( v = 0; v < nValues; v++ )
            {
                pNodeNew = Abc_NtkCreateNode( pNtkNew );
                pNodeNew->pData = Abc_SopEncoderPos( (Mem_Flex_t *)pNtkNew->pManFunc, v, nValues );
                pNetNew = Abc_NtkCreateNet( pNtkNew );
                pTermNew = Abc_NtkCreateBi( pNtkNew );
                Abc_ObjAddFanin( pNodeNew, pNet->pCopy );
                Abc_ObjAddFanin( pNetNew, pNodeNew );
                Abc_ObjAddFanin( pTermNew, pNetNew );
                Abc_ObjAddFanin( pBoxNew, pTermNew );
            }
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
    }
    else
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            nBits = Abc_Base2Log( nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pNodeNew = Abc_NtkCreateNode( pNtkNew );
                pNodeNew->pData = Abc_SopEncoderLog( (Mem_Flex_t *)pNtkNew->pManFunc, k, nValues );
                pNetNew = Abc_NtkCreateNet( pNtkNew );
                pTermNew = Abc_NtkCreateBi( pNtkNew );
                Abc_ObjAddFanin( pNodeNew, pNet->pCopy );
                Abc_ObjAddFanin( pNetNew, pNodeNew );
                Abc_ObjAddFanin( pTermNew, pNetNew );
                Abc_ObjAddFanin( pBoxNew, pTermNew );
            }
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
    }

    // encode the CO nets
    if ( fUsePositional )
    {
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
            if ( Abc_NodeIsTravIdCurrent(pNet) )
                continue;
            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            pNodeNew = Abc_NtkCreateNode( pNtkNew );
            pNodeNew->pData = Abc_SopDecoderPos( (Mem_Flex_t *)pNtkNew->pManFunc, nValues );
            for ( v = 0; v < nValues; v++ )
            {
                pTermNew = Abc_NtkCreateBo( pNtkNew );
                pNetNew = Abc_NtkCreateNet( pNtkNew );
                Abc_ObjAddFanin( pTermNew, pBoxNew );
                Abc_ObjAddFanin( pNetNew, pTermNew );
                Abc_ObjAddFanin( pNodeNew, pNetNew );
            }
            Abc_ObjAddFanin( pNet->pCopy, pNodeNew );
        }
    }
    else
    {
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
            if ( Abc_NodeIsTravIdCurrent(pNet) )
                continue;
            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            nBits = Abc_Base2Log( nValues );
            pNodeNew = Abc_NtkCreateNode( pNtkNew );
            pNodeNew->pData = Abc_SopDecoderLog( (Mem_Flex_t *)pNtkNew->pManFunc, nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pTermNew = Abc_NtkCreateBo( pNtkNew );
                pNetNew = Abc_NtkCreateNet( pNtkNew );
                Abc_ObjAddFanin( pTermNew, pBoxNew );
                Abc_ObjAddFanin( pNetNew, pTermNew );
                Abc_ObjAddFanin( pNodeNew, pNetNew );
            }
            Abc_ObjAddFanin( pNet->pCopy, pNodeNew );
        }
    }

    // if it is a BLIF-MV netlist transfer the values of all nets
    if ( Abc_NtkHasBlifMv(pNtk) && Abc_NtkMvVar(pNtk) )
    {
        if ( Abc_NtkMvVar( pNtkNew ) == NULL )
            Abc_NtkStartMvVars( pNtkNew );
        Abc_NtkForEachNet( pNtk, pObj, i )
            if ( pObj->pCopy )
                Abc_NtkSetMvVarValues( pObj->pCopy, Abc_ObjMvVarNum(pObj) );
    }

    // check integrity
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        fprintf( stdout, "Abc_NtkSkeletonBlifMv(): Network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}